

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::impl::distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute_inplace
               (vector<int,_std::allocator<int>_> *c,comm *comm)

{
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  pointer piVar4;
  ulong total_size;
  vector<int,_std::allocator<int>_> *pvVar5;
  _func_int **pp_Var6;
  pointer puVar7;
  _func_int *p_Var8;
  long lVar9;
  size_type __new_size;
  int rank_1;
  size_t local_size;
  int result;
  signed_size_t surplus;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  custom_op<unsigned_long,_true> op;
  uint local_c4;
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<int,_std::allocator<int>_> *local_a0;
  long local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  custom_op<unsigned_long,_true> local_78;
  
  if (comm->m_size != 1) {
    local_c0 = (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    local_a0 = c;
    custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
              ((custom_op<unsigned_long,true> *)&local_78);
    MPI_Allreduce(&local_c0,&local_b8,1,local_78.m_type_copy,local_78.m_op,comm->mpi_comm);
    total_size = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (uint)local_b8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    custom_op<unsigned_long,_true>::~custom_op(&local_78);
    iVar1 = comm->m_size;
    iVar2 = comm->m_rank;
    local_78._vptr_custom_op =
         (_func_int **)CONCAT44(local_78._vptr_custom_op._4_4_,(uint)(local_c0 == total_size));
    MPI_Allreduce(&local_78,&local_b8,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
    __new_size = total_size / (ulong)(long)iVar1 +
                 (ulong)((ulong)(long)iVar2 < total_size % (ulong)(long)iVar1);
    if ((uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      local_98 = local_c0 - __new_size;
      allgather<long>((vector<long,_std::allocator<long>_> *)&local_78,&local_98,1,comm);
      pvVar5 = local_a0;
      if (local_78._vptr_custom_op !=
          (_func_int **)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
        p_Var8 = (_func_int *)0x0;
        pp_Var6 = local_78._vptr_custom_op;
        do {
          p_Var8 = p_Var8 + (long)*pp_Var6;
          pp_Var6 = pp_Var6 + 1;
        } while (pp_Var6 !=
                 (_func_int **)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_)
        ;
        if (p_Var8 != (_func_int *)0x0) {
          MPI_Comm_rank(&ompi_mpi_comm_world,&local_b8);
          printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
                 (ulong)(uint)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                 ,0x13f,"distribute_inplace",
                 "std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0")
          ;
          fflush(_stdout);
          MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
        }
      }
      surplus_send_pairing
                (&local_b8,(vector<long,_std::allocator<long>_> *)&local_78,comm->m_size,
                 comm->m_rank,false);
      all2all<unsigned_long>(&local_90,&local_b8,comm);
      if (local_98 < 1) {
        puVar7 = (pointer)CONCAT44(local_b8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_b8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if (puVar7 != local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          lVar9 = 0;
          do {
            lVar9 = lVar9 + *puVar7;
            puVar7 = puVar7 + 1;
          } while (puVar7 != local_b8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          if (lVar9 != 0) {
            MPI_Comm_rank(&ompi_mpi_comm_world,&local_c4);
            printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_c4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                   ,0x14b,"distribute_inplace",
                   "std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0");
            fflush(_stdout);
            MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
          }
        }
        std::vector<int,_std::allocator<int>_>::resize(pvVar5,__new_size);
        all2allv<int>((int *)0x0,&local_b8,
                      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + local_c0,&local_90,comm);
      }
      else {
        if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar9 = 0;
          puVar7 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            lVar9 = lVar9 + *puVar7;
            puVar7 = puVar7 + 1;
          } while (puVar7 != local_90.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          if (lVar9 != 0) {
            MPI_Comm_rank(&ompi_mpi_comm_world,&local_c4);
            printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_c4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                   ,0x146,"distribute_inplace",
                   "std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0");
            fflush(_stdout);
            MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
          }
        }
        all2allv<int>((pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (local_c0 - local_98),&local_b8,(int *)0x0,
                      &local_90,comm);
        std::vector<int,_std::allocator<int>_>::resize(pvVar5,__new_size);
      }
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_b8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (uint)local_b8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_b8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_b8.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
    }
    else {
      local_78._vptr_custom_op = (_func_int **)0x0;
      local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object = (pointer)0x0;
      local_78.m_user_func.super__Function_base._M_functor._8_8_ = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&local_78,__new_size);
      pvVar5 = local_a0;
      distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_78._vptr_custom_op,total_size,comm);
      pp_Var6 = (_func_int **)
                (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var3 = (_func_int **)
                (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      piVar4 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_78._vptr_custom_op;
      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_;
      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_78.m_user_func.super__Function_base._M_functor._8_8_;
      local_78._vptr_custom_op = pp_Var6;
      local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object = pp_Var3;
      local_78.m_user_func.super__Function_base._M_functor._8_8_ = piVar4;
    }
    if (local_78._vptr_custom_op != (_func_int **)0x0) {
      operator_delete(local_78._vptr_custom_op);
    }
  }
  return;
}

Assistant:

inline static void distribute_inplace(Container& c, const mxx::comm& comm) {
        // custom implementation: don't need full sized buffers, only for receiving surpluses)
        // if single process, don't do anything
        if (comm.size() == 1)
            return;

        typedef typename std::iterator_traits<decltype(std::begin(c))>::value_type T;

        // get sizes
        size_t local_size = c.size();
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());

        if (mxx::any_of(local_size == total_size, comm)) {
            // use scatterv instead of all2all based communication
            Container result;
            result.resize(part.local_size());
            impl::distribute_scatter(std::begin(c), std::end(c), std::begin(result), total_size, comm);
            c.swap(result);
        } else {
            // use surplus send-pairing to minimize total communication volume
            // TODO: use all2all or send/recv depending on the maximum number of
            //       paired processes

            // get surplus
            impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

            // allgather surpluses
            // TODO figure out how to do surplus send pairing without requiring allgather
            std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
            MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0);

            // get send counts
            std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
            std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

            if (surplus > 0) {
                MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0);
                // TODO: use iterators not pointers
                mxx::all2allv(&(*(std::begin(c)+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
                c.resize(part.local_size());
            } else {
                MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0);
                c.resize(part.local_size());
                mxx::all2allv((T*)nullptr, send_counts, &(*(std::begin(c)+local_size)), recv_counts, comm);
            }
        }
    }